

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3auxBestIndexMethod(sqlite3_vtab *pVTab,sqlite3_index_info *pInfo)

{
  uchar uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uchar *puVar11;
  ulong uVar12;
  
  if (((pInfo->nOrderBy == 1) && (pInfo->aOrderBy->iColumn == 0)) && (pInfo->aOrderBy->desc == '\0')
     ) {
    pInfo->orderByConsumed = 1;
  }
  if ((long)pInfo->nConstraint < 1) {
    uVar5 = 0xffffffff;
    uVar3 = 0xffffffff;
    uVar2 = 0xffffffff;
    uVar9 = 0xffffffff;
  }
  else {
    puVar11 = &pInfo->aConstraint->usable;
    uVar10 = 0xffffffff;
    uVar12 = 0;
    uVar2 = 0xffffffff;
    uVar4 = 0xffffffff;
    uVar7 = 0xffffffff;
    do {
      if (*puVar11 != '\0') {
        uVar1 = puVar11[-1];
        if (((sqlite3_index_constraint *)(puVar11 + -5))->iColumn == 0) {
          if (uVar1 == '\x02') {
            uVar10 = uVar12 & 0xffffffff;
          }
          if ((uVar1 - 8 & 0xf7) == 0) {
            uVar4 = uVar12 & 0xffffffff;
          }
          if (uVar1 == '\x04') {
            uVar7 = uVar12 & 0xffffffff;
          }
          if (uVar1 == ' ') {
            uVar7 = uVar12 & 0xffffffff;
          }
        }
        uVar8 = uVar2;
        if (uVar1 == '\x02') {
          uVar8 = uVar12 & 0xffffffff;
        }
        if (((sqlite3_index_constraint *)(puVar11 + -5))->iColumn == 4) {
          uVar2 = uVar8;
        }
      }
      uVar3 = (uint)uVar4;
      uVar5 = (uint)uVar7;
      uVar9 = (uint)uVar10;
      uVar12 = uVar12 + 1;
      puVar11 = puVar11 + 0xc;
    } while ((long)pInfo->nConstraint != uVar12);
  }
  if ((int)uVar9 < 0) {
    pInfo->idxNum = 0;
    pInfo->estimatedCost = 20000.0;
    if ((int)uVar5 < 0) {
      iVar6 = 1;
    }
    else {
      pInfo->idxNum = 2;
      pInfo->aConstraintUsage[uVar5].argvIndex = 1;
      pInfo->estimatedCost = 10000.0;
      iVar6 = 2;
    }
    if (-1 < (int)uVar3) {
      pInfo->idxNum = pInfo->idxNum + 4;
      pInfo->aConstraintUsage[uVar3].argvIndex = iVar6;
      iVar6 = iVar6 + 1;
      pInfo->estimatedCost = pInfo->estimatedCost * 0.5;
    }
  }
  else {
    pInfo->idxNum = 1;
    pInfo->aConstraintUsage[uVar9].argvIndex = 1;
    pInfo->estimatedCost = 5.0;
    iVar6 = 2;
  }
  if (-1 < (int)uVar2) {
    pInfo->aConstraintUsage[uVar2].argvIndex = iVar6;
    pInfo->estimatedCost = pInfo->estimatedCost + -1.0;
  }
  return 0;
}

Assistant:

static int fts3auxBestIndexMethod(
  sqlite3_vtab *pVTab, 
  sqlite3_index_info *pInfo
){
  int i;
  int iEq = -1;
  int iGe = -1;
  int iLe = -1;
  int iLangid = -1;
  int iNext = 1;                  /* Next free argvIndex value */

  UNUSED_PARAMETER(pVTab);

  /* This vtab delivers always results in "ORDER BY term ASC" order. */
  if( pInfo->nOrderBy==1 
   && pInfo->aOrderBy[0].iColumn==0 
   && pInfo->aOrderBy[0].desc==0
  ){
    pInfo->orderByConsumed = 1;
  }

  /* Search for equality and range constraints on the "term" column. 
  ** And equality constraints on the hidden "languageid" column. */
  for(i=0; i<pInfo->nConstraint; i++){
    if( pInfo->aConstraint[i].usable ){
      int op = pInfo->aConstraint[i].op;
      int iCol = pInfo->aConstraint[i].iColumn;

      if( iCol==0 ){
        if( op==SQLITE_INDEX_CONSTRAINT_EQ ) iEq = i;
        if( op==SQLITE_INDEX_CONSTRAINT_LT ) iLe = i;
        if( op==SQLITE_INDEX_CONSTRAINT_LE ) iLe = i;
        if( op==SQLITE_INDEX_CONSTRAINT_GT ) iGe = i;
        if( op==SQLITE_INDEX_CONSTRAINT_GE ) iGe = i;
      }
      if( iCol==4 ){
        if( op==SQLITE_INDEX_CONSTRAINT_EQ ) iLangid = i;
      }
    }
  }

  if( iEq>=0 ){
    pInfo->idxNum = FTS4AUX_EQ_CONSTRAINT;
    pInfo->aConstraintUsage[iEq].argvIndex = iNext++;
    pInfo->estimatedCost = 5;
  }else{
    pInfo->idxNum = 0;
    pInfo->estimatedCost = 20000;
    if( iGe>=0 ){
      pInfo->idxNum += FTS4AUX_GE_CONSTRAINT;
      pInfo->aConstraintUsage[iGe].argvIndex = iNext++;
      pInfo->estimatedCost /= 2;
    }
    if( iLe>=0 ){
      pInfo->idxNum += FTS4AUX_LE_CONSTRAINT;
      pInfo->aConstraintUsage[iLe].argvIndex = iNext++;
      pInfo->estimatedCost /= 2;
    }
  }
  if( iLangid>=0 ){
    pInfo->aConstraintUsage[iLangid].argvIndex = iNext++;
    pInfo->estimatedCost--;
  }

  return SQLITE_OK;
}